

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

Split * __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::Instance>,_2UL>
::TemporalBinInfo::best
          (Split *__return_storage_ptr__,TemporalBinInfo *this,int logBlockSize,BBox1f time_range,
          SetMB *set)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  float fVar12;
  float fVar13;
  float center_time;
  undefined1 auVar14 [16];
  float fVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = time_range;
  bVar5 = (byte)logBlockSize;
  auVar14 = vmovshdup_avx(auVar11._0_16_);
  fVar12 = auVar14._0_4_;
  fVar9 = time_range.lower;
  fVar1 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar10 = (set->super_PrimInfoMB).max_time_range.upper - fVar1;
  fVar15 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar13 = (((fVar9 * 0.5 + fVar12 * 0.5) - fVar1) / fVar10) * fVar15;
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar14 = vandps_avx(ZEXT416((uint)fVar13),auVar14);
  auVar18._8_4_ = 0x3effffff;
  auVar18._0_8_ = 0x3effffff3effffff;
  auVar18._12_4_ = 0x3effffff;
  auVar14 = vorps_avx(auVar18,auVar14);
  auVar14 = ZEXT416((uint)(fVar13 + auVar14._0_4_));
  auVar14 = vroundss_avx(auVar14,auVar14,0xb);
  lVar7 = 1L << (bVar5 & 0x3f);
  fVar1 = (auVar14._0_4_ / fVar15) * fVar10 + fVar1;
  uVar6 = (this->count1[0] + lVar7) - 1 >> (bVar5 & 0x3f);
  fVar13 = INFINITY;
  iVar16 = 0;
  if ((fVar9 < fVar1) && (fVar1 < fVar12)) {
    uVar8 = (lVar7 + this->count0[0]) - 1 >> (bVar5 & 0x3f);
    if (uVar8 == 0) {
      fVar10 = 0.0;
    }
    else {
      auVar2 = vsubps_avx((undefined1  [16])this->bounds0[0].bounds0.upper.field_0,
                          (undefined1  [16])this->bounds0[0].bounds0.lower.field_0);
      auVar17 = vsubps_avx((undefined1  [16])this->bounds0[0].bounds1.upper.field_0,
                           (undefined1  [16])this->bounds0[0].bounds1.lower.field_0);
      auVar18 = vshufpd_avx(auVar2,auVar2,1);
      auVar14 = vinsertps_avx(auVar17,auVar2,0x4c);
      auVar18 = vinsertps_avx(auVar18,auVar17,0x9c);
      auVar2 = vinsertps_avx(auVar2,auVar17,0x1c);
      auVar17._0_4_ = (auVar14._0_4_ + auVar18._0_4_) * auVar2._0_4_ + auVar14._0_4_ * auVar18._0_4_
      ;
      auVar17._4_4_ = (auVar14._4_4_ + auVar18._4_4_) * auVar2._4_4_ + auVar14._4_4_ * auVar18._4_4_
      ;
      auVar17._8_4_ = (auVar14._8_4_ + auVar18._8_4_) * auVar2._8_4_ + auVar14._8_4_ * auVar18._8_4_
      ;
      auVar17._12_4_ =
           (auVar14._12_4_ + auVar18._12_4_) * auVar2._12_4_ + auVar14._12_4_ * auVar18._12_4_;
      auVar14 = vhaddps_avx(auVar17,auVar17);
      fVar10 = (fVar1 - fVar9) * auVar14._0_4_ * 0.5 * (float)uVar8;
    }
    if (uVar6 == 0) {
      fVar13 = 0.0;
    }
    else {
      auVar3 = vsubps_avx((undefined1  [16])this->bounds1[0].bounds0.upper.field_0,
                          (undefined1  [16])this->bounds1[0].bounds0.lower.field_0);
      auVar4 = vsubps_avx((undefined1  [16])this->bounds1[0].bounds1.upper.field_0,
                          (undefined1  [16])this->bounds1[0].bounds1.lower.field_0);
      auVar14 = vmovshdup_avx(auVar3);
      auVar2 = vshufpd_avx(auVar3,auVar3,1);
      auVar18 = vmovshdup_avx(auVar4);
      auVar17 = vshufpd_avx(auVar4,auVar4,1);
      fVar13 = (fVar12 - fVar1) *
               ((auVar2._0_4_ + auVar14._0_4_) * auVar3._0_4_ + auVar2._0_4_ * auVar14._0_4_ +
               (auVar18._0_4_ + auVar17._0_4_) * auVar4._0_4_ + auVar18._0_4_ * auVar17._0_4_) * 0.5
               * (float)uVar6;
    }
    fVar10 = fVar10 + fVar13;
    fVar13 = INFINITY;
    auVar14 = vcmpss_avx(ZEXT416((uint)fVar10),SUB6416(ZEXT464(0x7f800000),0),0xc);
    auVar14 = vandps_avx(auVar14,ZEXT416((uint)fVar1));
    iVar16 = auVar14._0_4_;
    if (fVar10 != INFINITY) {
      fVar13 = fVar10 * 1.25;
    }
  }
  __return_storage_ptr__->sah = fVar13;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = iVar16;
  __return_storage_ptr__->data = 2;
  return __return_storage_ptr__;
}

Assistant:

Split best(int logBlockSize, BBox1f time_range, const SetMB& set)
          {
            float bestSAH = inf;
            float bestPos = 0.0f;
            for (int b=0; b<BINS-1; b++)
            {
              float t = float(b+1)/float(BINS);
              float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* calculate sah */
              const size_t lCount = (count0[b]+(size_t(1) << logBlockSize)-1) >> int(logBlockSize);
              const size_t rCount = (count1[b]+(size_t(1) << logBlockSize)-1) >> int(logBlockSize);
              float sah0 = expectedApproxHalfArea(bounds0[b])*float(lCount)*dt0.size();
              float sah1 = expectedApproxHalfArea(bounds1[b])*float(rCount)*dt1.size();
              if (unlikely(lCount == 0)) sah0 = 0.0f; // happens for initial splits when objects not alive over entire shutter time
              if (unlikely(rCount == 0)) sah1 = 0.0f;
              const float sah = sah0+sah1;
              if (sah < bestSAH) {
                bestSAH = sah;
                bestPos = center_time;
              }
            }
            return Split(bestSAH*MBLUR_TIME_SPLIT_THRESHOLD,(unsigned)Split::SPLIT_TEMPORAL,0,bestPos);
          }